

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.h
# Opt level: O0

bool absl::lts_20250127::operator==(uint128 lhs,uint128 rhs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  unsigned___int128 *puVar7;
  unsigned___int128 *puVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  uint128 *this;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  byte bVar22;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  uint64_t local_28;
  uint128 rhs_local;
  uint128 lhs_local;
  
  this = (uint128 *)lhs.hi_;
  rhs_local.hi_ = lhs.lo_;
  rhs_local.lo_ = rhs.hi_;
  local_28 = rhs.lo_;
  puVar7 = uint128::operator_cast_to_unsigned___int128((unsigned___int128 *)&rhs_local.hi_,this);
  puVar8 = uint128::operator_cast_to_unsigned___int128((unsigned___int128 *)&local_28,this);
  local_58 = (char)puVar7;
  cStack_57 = (char)((ulong)puVar7 >> 8);
  cStack_56 = (char)((ulong)puVar7 >> 0x10);
  cStack_55 = (char)((ulong)puVar7 >> 0x18);
  cStack_54 = (char)((ulong)puVar7 >> 0x20);
  cStack_53 = (char)((ulong)puVar7 >> 0x28);
  cStack_52 = (char)((ulong)puVar7 >> 0x30);
  cStack_51 = (char)((ulong)puVar7 >> 0x38);
  cStack_50 = (char)extraout_RDX;
  cStack_4f = (char)((ulong)extraout_RDX >> 8);
  cStack_4e = (char)((ulong)extraout_RDX >> 0x10);
  cStack_4d = (char)((ulong)extraout_RDX >> 0x18);
  cStack_4c = (char)((ulong)extraout_RDX >> 0x20);
  cStack_4b = (char)((ulong)extraout_RDX >> 0x28);
  cStack_4a = (char)((ulong)extraout_RDX >> 0x30);
  cStack_49 = (char)((ulong)extraout_RDX >> 0x38);
  local_48 = (char)puVar8;
  cStack_47 = (char)((ulong)puVar8 >> 8);
  cStack_46 = (char)((ulong)puVar8 >> 0x10);
  cStack_45 = (char)((ulong)puVar8 >> 0x18);
  cStack_44 = (char)((ulong)puVar8 >> 0x20);
  cStack_43 = (char)((ulong)puVar8 >> 0x28);
  cStack_42 = (char)((ulong)puVar8 >> 0x30);
  cStack_41 = (char)((ulong)puVar8 >> 0x38);
  cStack_40 = (char)extraout_RDX_00;
  cStack_3f = (char)((ulong)extraout_RDX_00 >> 8);
  cStack_3e = (char)((ulong)extraout_RDX_00 >> 0x10);
  cStack_3d = (char)((ulong)extraout_RDX_00 >> 0x18);
  cStack_3c = (char)((ulong)extraout_RDX_00 >> 0x20);
  cStack_3b = (char)((ulong)extraout_RDX_00 >> 0x28);
  cStack_3a = (char)((ulong)extraout_RDX_00 >> 0x30);
  cStack_39 = (char)((ulong)extraout_RDX_00 >> 0x38);
  cVar9 = -(cStack_56 == cStack_46);
  cVar10 = -(cStack_55 == cStack_45);
  cVar11 = -(cStack_54 == cStack_44);
  cVar12 = -(cStack_53 == cStack_43);
  cVar13 = -(cStack_52 == cStack_42);
  cVar14 = -(cStack_51 == cStack_41);
  cVar15 = -(cStack_50 == cStack_40);
  cVar16 = -(cStack_4f == cStack_3f);
  cVar17 = -(cStack_4e == cStack_3e);
  cVar18 = -(cStack_4d == cStack_3d);
  cVar19 = -(cStack_4c == cStack_3c);
  cVar20 = -(cStack_4b == cStack_3b);
  cVar21 = -(cStack_4a == cStack_3a);
  bVar22 = -(cStack_49 == cStack_39);
  auVar1[1] = -(cStack_57 == cStack_47);
  auVar1[0] = -(local_58 == local_48);
  auVar1[2] = cVar9;
  auVar1[3] = cVar10;
  auVar1[4] = cVar11;
  auVar1[5] = cVar12;
  auVar1[6] = cVar13;
  auVar1[7] = cVar14;
  auVar1[8] = cVar15;
  auVar1[9] = cVar16;
  auVar1[10] = cVar17;
  auVar1[0xb] = cVar18;
  auVar1[0xc] = cVar19;
  auVar1[0xd] = cVar20;
  auVar1[0xe] = cVar21;
  auVar1[0xf] = bVar22;
  auVar2[1] = -(cStack_57 == cStack_47);
  auVar2[0] = -(local_58 == local_48);
  auVar2[2] = cVar9;
  auVar2[3] = cVar10;
  auVar2[4] = cVar11;
  auVar2[5] = cVar12;
  auVar2[6] = cVar13;
  auVar2[7] = cVar14;
  auVar2[8] = cVar15;
  auVar2[9] = cVar16;
  auVar2[10] = cVar17;
  auVar2[0xb] = cVar18;
  auVar2[0xc] = cVar19;
  auVar2[0xd] = cVar20;
  auVar2[0xe] = cVar21;
  auVar2[0xf] = bVar22;
  auVar6[1] = cVar10;
  auVar6[0] = cVar9;
  auVar6[2] = cVar11;
  auVar6[3] = cVar12;
  auVar6[4] = cVar13;
  auVar6[5] = cVar14;
  auVar6[6] = cVar15;
  auVar6[7] = cVar16;
  auVar6[8] = cVar17;
  auVar6[9] = cVar18;
  auVar6[10] = cVar19;
  auVar6[0xb] = cVar20;
  auVar6[0xc] = cVar21;
  auVar6[0xd] = bVar22;
  auVar5[1] = cVar11;
  auVar5[0] = cVar10;
  auVar5[2] = cVar12;
  auVar5[3] = cVar13;
  auVar5[4] = cVar14;
  auVar5[5] = cVar15;
  auVar5[6] = cVar16;
  auVar5[7] = cVar17;
  auVar5[8] = cVar18;
  auVar5[9] = cVar19;
  auVar5[10] = cVar20;
  auVar5[0xb] = cVar21;
  auVar5[0xc] = bVar22;
  auVar4[1] = cVar12;
  auVar4[0] = cVar11;
  auVar4[2] = cVar13;
  auVar4[3] = cVar14;
  auVar4[4] = cVar15;
  auVar4[5] = cVar16;
  auVar4[6] = cVar17;
  auVar4[7] = cVar18;
  auVar4[8] = cVar19;
  auVar4[9] = cVar20;
  auVar4[10] = cVar21;
  auVar4[0xb] = bVar22;
  auVar3[1] = cVar13;
  auVar3[0] = cVar12;
  auVar3[2] = cVar14;
  auVar3[3] = cVar15;
  auVar3[4] = cVar16;
  auVar3[5] = cVar17;
  auVar3[6] = cVar18;
  auVar3[7] = cVar19;
  auVar3[8] = cVar20;
  auVar3[9] = cVar21;
  auVar3[10] = bVar22;
  return (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 |
                  (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3 |
                  (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                  (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                  (ushort)((byte)(CONCAT19(bVar22,CONCAT18(cVar21,CONCAT17(cVar20,CONCAT16(cVar19,
                                                  CONCAT15(cVar18,CONCAT14(cVar17,CONCAT13(cVar16,
                                                  CONCAT12(cVar15,CONCAT11(cVar14,cVar13))))))))) >>
                                 7) & 1) << 6 |
                  (ushort)((byte)(CONCAT18(bVar22,CONCAT17(cVar21,CONCAT16(cVar20,CONCAT15(cVar19,
                                                  CONCAT14(cVar18,CONCAT13(cVar17,CONCAT12(cVar16,
                                                  CONCAT11(cVar15,cVar14)))))))) >> 7) & 1) << 7 |
                 (ushort)(bVar22 >> 7) << 0xf) == 0xffff;
}

Assistant:

constexpr bool operator==(uint128 lhs, uint128 rhs) {
#if defined(ABSL_HAVE_INTRINSIC_INT128)
  return static_cast<unsigned __int128>(lhs) ==
         static_cast<unsigned __int128>(rhs);
#else
  return (Uint128Low64(lhs) == Uint128Low64(rhs) &&
          Uint128High64(lhs) == Uint128High64(rhs));
#endif
}